

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hasshe2.c
# Opt level: O1

void hasshe2(void *input_buf,int n_bytes,uint32_t seed,void *output_state)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if ((n_bytes & 0xfU) != 0) {
    __assert_fail("n_bytes % 16 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/hasshe2.c"
                  ,0x3d,"void hasshe2(const void *, int, uint32_t, void *)");
  }
  auVar4 = _DAT_001891d0;
  auVar5 = _DAT_001891d0;
  if (0xf < n_bytes) {
    iVar1 = n_bytes + 0x10;
    do {
      auVar3 = *input_buf;
      input_buf = (void *)((long)input_buf + 0x10);
      auVar2 = vpunpckhdq_avx(auVar3,(undefined1  [16])0x0);
      auVar2 = vpmullq_avx512vl(auVar2,_DAT_001891e0);
      auVar4 = vpaddq_avx(auVar2,auVar4);
      auVar3 = vpmovzxdq_avx(auVar3);
      auVar3 = vpmullq_avx512vl(auVar3,_DAT_001891f0);
      auVar5 = vpaddq_avx(auVar3,auVar5);
      auVar3 = vpsrlq_avx(auVar4,0x1d);
      auVar2 = vpsrlq_avx(auVar5,0x1d);
      auVar6 = vpsllq_avx(auVar3 ^ auVar4,0x10);
      auVar4 = vpaddq_avx(auVar6,auVar3 ^ auVar4);
      auVar3 = vpsllq_avx(auVar2 ^ auVar5,0x10);
      auVar5 = vpaddq_avx(auVar3,auVar2 ^ auVar5);
      auVar3 = vpsrlq_avx(auVar4,0x15);
      auVar2 = vpsrlq_avx(auVar5,0x15);
      auVar6 = vpslldq_avx(auVar3 ^ auVar4,4);
      auVar4 = vpaddq_avx(auVar3 ^ auVar4,auVar6);
      auVar3 = vpslldq_avx(auVar2 ^ auVar5,4);
      auVar5 = vpaddq_avx(auVar2 ^ auVar5,auVar3);
      auVar4 = vpsubq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(auVar5,0x39);
      auVar3 = vpsubq_avx(auVar5,auVar4);
      auVar5 = vpshufd_avx(auVar4,0x1e);
      auVar4 = vpsubq_avx(auVar5,auVar3);
      auVar5 = vpshufd_avx(auVar3,0x93);
      auVar5 = vpsubq_avx(auVar5,auVar4);
      auVar4 = vpshufd_avx(auVar4,0x93);
      auVar4 = vpsubq_avx(auVar4,auVar5);
      iVar1 = iVar1 + -0x10;
    } while (0x1f < iVar1);
  }
  auVar3 = vpunpckhdq_avx(auVar4,(undefined1  [16])0x0);
  auVar3 = vpmullq_avx512vl(auVar3,_DAT_001891e0);
  auVar3 = vpaddq_avx(auVar3,_DAT_001891d0);
  auVar4 = vpmovzxdq_avx(auVar4);
  auVar4 = vpmullq_avx512vl(auVar4,_DAT_001891f0);
  auVar5 = vpaddq_avx(auVar4,auVar5);
  auVar4 = vpsrlq_avx(auVar3,0x1d);
  auVar2 = vpsrlq_avx(auVar5,0x1d);
  auVar6 = vpsllq_avx(auVar4 ^ auVar3,0x10);
  auVar4 = vpaddq_avx(auVar6,auVar4 ^ auVar3);
  auVar3 = vpsllq_avx(auVar2 ^ auVar5,0x10);
  auVar5 = vpaddq_avx(auVar3,auVar2 ^ auVar5);
  auVar3 = vpsrlq_avx(auVar4,0x15);
  auVar2 = vpsrlq_avx(auVar5,0x15);
  auVar6 = vpslldq_avx(auVar3 ^ auVar4,4);
  auVar4 = vpaddq_avx(auVar3 ^ auVar4,auVar6);
  auVar3 = vpslldq_avx(auVar2 ^ auVar5,4);
  auVar5 = vpaddq_avx(auVar2 ^ auVar5,auVar3);
  auVar4 = vpsubq_avx(auVar4,auVar5);
  auVar5 = vpshufd_avx(auVar5,0x39);
  auVar3 = vpsubq_avx(auVar5,auVar4);
  auVar5 = vpshufd_avx(auVar4,0x1e);
  auVar4 = vpsubq_avx(auVar5,auVar3);
  auVar5 = vpshufd_avx(auVar3,0x93);
  auVar3 = vpsubq_avx(auVar5,auVar4);
  auVar5 = vpshufd_avx(auVar4,0x93);
  auVar5 = vpsubq_avx(auVar5,auVar3);
  *(undefined1 (*) [16])output_state = auVar5;
  *(undefined1 (*) [16])((long)output_state + 0x10) = auVar3;
  return;
}

Assistant:

void hasshe2(const void *input_buf, int n_bytes, uint32_t seed, void *output_state)
{
  __m128i coeffs_1, coeffs_2, rnd_data, input, state_1, state_2;

  assert(n_bytes % 16 == 0);

  coeffs_1 = _mm_load_si128((void *) coeffs);
  coeffs_2 = _mm_load_si128((void *) (coeffs + 4));
  rnd_data = _mm_load_si128((void *) (coeffs + 8));

  /* Initialize internal state to something random.  (Alternatively,
     if hashing a chain of data, read in the previous hash result from
     somewhere.) */
  state_1 = state_2 = rnd_data;

  while (n_bytes >= 16) {
    /* Read in 16 bytes, or 128 bits, from buf.  Advance buf and
       decrement n_bytes accordingly. */
    input = _mm_loadu_si128((void *) input_buf);
    input_buf += 16;
    n_bytes -= 16;

    COMBINE_AND_MIX(coeffs_1, coeffs_2, state_1, state_2, input);
  }

  /* Postprocessing.  Copy half of the internal state into fake input,
     replace it with the constant rnd_data, and do one combine and mix
     phase more. */ 
  input = state_1;
  state_1 = rnd_data;
  COMBINE_AND_MIX(coeffs_1, coeffs_2, state_1, state_2, input);

  _mm_storeu_si128((void *) output_state, state_1);
  _mm_storeu_si128((void *) (output_state + 16), state_2);
}